

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O0

void bubble_down(nghttp2_pq *pq,size_t index)

{
  int iVar1;
  size_t local_30;
  size_t minindex;
  size_t j;
  size_t i;
  size_t index_local;
  nghttp2_pq *pq_local;
  
  i = index;
  while( true ) {
    minindex = i * 2;
    local_30 = i;
    j = 0;
    while ((minindex = minindex + 1, j < 2 && (minindex < pq->length))) {
      iVar1 = (*pq->less)(pq->q[minindex],pq->q[local_30]);
      if (iVar1 != 0) {
        local_30 = minindex;
      }
      j = j + 1;
    }
    if (local_30 == i) break;
    swap(pq,i,local_30);
    i = local_30;
  }
  return;
}

Assistant:

static void bubble_down(nghttp2_pq *pq, size_t index) {
  size_t i, j, minindex;
  for (;;) {
    j = index * 2 + 1;
    minindex = index;
    for (i = 0; i < 2; ++i, ++j) {
      if (j >= pq->length) {
        break;
      }
      if (pq->less(pq->q[j], pq->q[minindex])) {
        minindex = j;
      }
    }
    if (minindex == index) {
      return;
    }
    swap(pq, index, minindex);
    index = minindex;
  }
}